

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_dce.cpp
# Opt level: O2

void __thiscall
spvtools::opt::VectorDCE::MarkVectorShuffleUsesAsLive
          (VectorDCE *this,WorkListItem *current_item,LiveComponentMap *live_components,
          vector<spvtools::opt::VectorDCE::WorkListItem,_std::allocator<spvtools::opt::VectorDCE::WorkListItem>_>
          *work_list)

{
  WorkListItem *pWVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  DefUseManager *this_00;
  uint32_t i;
  VectorDCE *this_01;
  VectorDCE *pVVar7;
  WorkListItem second_operand;
  WorkListItem first_operand;
  undefined1 local_70 [40];
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  this_00 = IRContext::get_def_use_mgr((this->super_MemPass).super_Pass.context_);
  WorkListItem::WorkListItem(&first_operand);
  uVar3 = Instruction::GetSingleWordInOperand(current_item->instruction,0);
  first_operand.instruction = analysis::DefUseManager::GetDef(this_00,uVar3);
  WorkListItem::WorkListItem(&second_operand);
  uVar3 = Instruction::GetSingleWordInOperand(current_item->instruction,1);
  second_operand.instruction = analysis::DefUseManager::GetDef(this_00,uVar3);
  uVar3 = Instruction::type_id(first_operand.instruction);
  uVar4 = GetVectorComponentCount(this,uVar3);
  uVar3 = Instruction::type_id(second_operand.instruction);
  uVar5 = GetVectorComponentCount(this,uVar3);
  uVar3 = 2;
  do {
    uVar6 = Instruction::NumInOperands(current_item->instruction);
    if (uVar6 <= uVar3) {
      pVVar7 = (VectorDCE *)(local_70 + 0x20);
      this_01 = pVVar7;
      WorkListItem::WorkListItem((WorkListItem *)pVVar7,&first_operand);
      AddItemToWorkListIfNeeded(this_01,(WorkListItem *)pVVar7,live_components,work_list);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
      pVVar7 = (VectorDCE *)local_70;
      WorkListItem::WorkListItem((WorkListItem *)local_70,&second_operand);
      AddItemToWorkListIfNeeded(pVVar7,(WorkListItem *)local_70,live_components,work_list);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)(local_70 + 8));
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &second_operand.components);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
                 &first_operand.components);
      return;
    }
    uVar6 = Instruction::GetSingleWordInOperand(current_item->instruction,uVar3);
    bVar2 = utils::BitVector::Get(&current_item->components,uVar3 - 2);
    if (bVar2) {
      i = uVar6 - uVar4;
      if (uVar6 < uVar4) {
        pWVar1 = &first_operand;
        i = uVar6;
      }
      else {
        if (uVar5 <= i) goto LAB_001a3d91;
        pWVar1 = &second_operand;
      }
      utils::BitVector::Set(&pWVar1->components,i);
    }
LAB_001a3d91:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

void VectorDCE::MarkVectorShuffleUsesAsLive(
    const WorkListItem& current_item,
    VectorDCE::LiveComponentMap* live_components,
    std::vector<WorkListItem>* work_list) {
  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();

  WorkListItem first_operand;
  first_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(0));
  WorkListItem second_operand;
  second_operand.instruction =
      def_use_mgr->GetDef(current_item.instruction->GetSingleWordInOperand(1));

  uint32_t size_of_first_operand =
      GetVectorComponentCount(first_operand.instruction->type_id());
  uint32_t size_of_second_operand =
      GetVectorComponentCount(second_operand.instruction->type_id());

  for (uint32_t in_op = 2; in_op < current_item.instruction->NumInOperands();
       ++in_op) {
    uint32_t index = current_item.instruction->GetSingleWordInOperand(in_op);
    if (current_item.components.Get(in_op - 2)) {
      if (index < size_of_first_operand) {
        first_operand.components.Set(index);
      } else if (index - size_of_first_operand < size_of_second_operand) {
        second_operand.components.Set(index - size_of_first_operand);
      }
    }
  }

  AddItemToWorkListIfNeeded(first_operand, live_components, work_list);
  AddItemToWorkListIfNeeded(second_operand, live_components, work_list);
}